

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O0

void __thiscall
CPP::WriteInitialization::addStringInitializer
          (WriteInitialization *this,Item *item,DomPropertyMap *properties,QString *name,int column,
          QString *directive)

{
  long lVar1;
  bool bVar2;
  undefined1 uVar3;
  WriteInitialization *this_00;
  DomString *str_00;
  QString *in_RCX;
  Item *in_RDX;
  QString *in_RDI;
  int in_R8D;
  QString *in_R9;
  long in_FS_OFFSET;
  bool translatable;
  DomString *str;
  DomProperty *p;
  QString value;
  QString text;
  DomString *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (WriteInitialization *)
            QHash<QString,_DomProperty_*>::value
                      ((QHash<QString,_DomProperty_*> *)
                       CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),in_RDI);
  if (this_00 != (WriteInitialization *)0x0) {
    str_00 = DomProperty::elementString((DomProperty *)this_00);
    toString((DomString *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    bVar2 = QString::isEmpty((QString *)0x13f72f);
    if (!bVar2) {
      uVar3 = needsTranslation<DomString>(in_stack_ffffffffffffff58);
      QString::QString((QString *)0x13f781);
      autoTrCall(this_00,str_00,(QString *)CONCAT17(uVar3,in_stack_ffffffffffffff68));
      uVar3 = (undefined1)((ulong)str_00 >> 0x38);
      QString::~QString((QString *)0x13f7a3);
      addInitializer(in_RDX,in_RCX,in_R8D,in_R9,(QString *)this_00,(bool)uVar3);
      QString::~QString((QString *)0x13f7d4);
    }
    QString::~QString((QString *)0x13f7e1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteInitialization::addStringInitializer(Item *item,
        const DomPropertyMap &properties, const QString &name, int column, const QString &directive) const
{
    if (const DomProperty *p = properties.value(name)) {
        DomString *str = p->elementString();
        QString text = toString(str);
        if (!text.isEmpty()) {
            bool translatable = needsTranslation(str);
            QString value = autoTrCall(str);
            addInitializer(item, name, column, value, directive, translatable);
        }
    }
}